

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void __thiscall ConvexDecomposition::Quaternion::Normalize(Quaternion *this)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  fVar1 = (this->super_float4).w;
  fVar2 = (this->super_float4).x;
  uVar3 = (this->super_float4).y;
  uVar4 = (this->super_float4).z;
  auVar6._0_4_ = (float)uVar3 * (float)uVar3;
  auVar6._4_4_ = (float)uVar4 * (float)uVar4;
  auVar6._8_8_ = 0;
  auVar5 = vmovshdup_avx(auVar6);
  auVar5 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + auVar6._0_4_ + auVar5._0_4_));
  auVar5 = vsqrtss_avx(auVar5,auVar5);
  if (auVar5._0_4_ < 1e-09) {
    (this->super_float4).x = 0.0;
    (this->super_float4).y = 0.0;
    (this->super_float4).z = 0.0;
    (this->super_float4).w = 1.0;
    return;
  }
  ConvexDecomposition::operator*=(this,1.0 / auVar5._0_4_);
  return;
}

Assistant:

void Quaternion::Normalize()
{
	float m = sqrtf(sqr(w)+sqr(x)+sqr(y)+sqr(z));
	if(m<0.000000001f) {
		w=1.0f;
		x=y=z=0.0f;
		return;
	}
	(*this) *= (1.0f/m);
}